

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall
dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  attenuation->e[0] = 1.0;
  attenuation->e[1] = 1.0;
  attenuation->e[2] = 1.0;
  dVar4 = this->ref_idx;
  if (rec->front_face != false) {
    dVar4 = 1.0 / dVar4;
  }
  dVar6 = (r_in->dir).e[2];
  dVar8 = (r_in->dir).e[0];
  dVar5 = (r_in->dir).e[1];
  dVar7 = 1.0 / SQRT(dVar6 * dVar6 + dVar8 * dVar8 + dVar5 * dVar5);
  dVar6 = dVar6 * dVar7;
  dVar8 = dVar7 * dVar8;
  dVar7 = dVar7 * dVar5;
  dVar5 = ((rec->normal).e[0] * -dVar8 - (rec->normal).e[1] * dVar7) - (rec->normal).e[2] * dVar6;
  if (1.0 <= dVar5) {
    dVar5 = 1.0;
  }
  dVar5 = 1.0 - dVar5 * dVar5;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar2 = (rec->normal).e[0];
  dVar3 = (rec->normal).e[1];
  dVar1 = (rec->normal).e[2];
  if (dVar5 * dVar4 <= 1.0) {
    dVar5 = -dVar6 * dVar1 + -dVar8 * dVar2 + dVar3 * -dVar7;
    dVar6 = (dVar1 * dVar5 + dVar6) * dVar4;
    dVar8 = dVar4 * (dVar8 + dVar5 * dVar2);
    dVar4 = dVar4 * (dVar7 + dVar5 * dVar3);
    dVar5 = SQRT(ABS(1.0 - (dVar6 * dVar6 + dVar8 * dVar8 + dVar4 * dVar4)));
    dVar8 = dVar8 - dVar5 * dVar2;
    dVar7 = dVar4 - dVar5 * dVar3;
    dVar6 = dVar6 - dVar1 * dVar5;
    dVar4 = r_in->tm;
  }
  else {
    dVar4 = dVar6 * dVar1 + dVar8 * dVar2 + dVar7 * dVar3;
    dVar4 = dVar4 + dVar4;
    dVar8 = dVar8 - dVar4 * dVar2;
    dVar7 = dVar7 - dVar4 * dVar3;
    dVar6 = dVar6 - dVar1 * dVar4;
    dVar4 = 0.0;
  }
  dVar5 = (rec->p).e[0];
  dVar1 = (rec->p).e[1];
  (scattered->orig).e[2] = (rec->p).e[2];
  (scattered->orig).e[0] = dVar5;
  (scattered->orig).e[1] = dVar1;
  (scattered->dir).e[0] = dVar8;
  (scattered->dir).e[1] = dVar7;
  (scattered->dir).e[2] = dVar6;
  scattered->tm = dVar4;
  return true;
}

Assistant:

virtual bool scatter (
            const ray& r_in,const hit_record& rec,vec3& attenuation,ray& scattered
    ) const {
        double etai_over_etat;
        attenuation = vec3(1.0, 1.0, 1.0);

        if (rec.front_face) {
            etai_over_etat = 1 / ref_idx;
        } else {
            etai_over_etat = ref_idx;
        }

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = ffmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = sqrt(1.0 - cos_theta * cos_theta);

        if (etai_over_etat * sin_theta > 1.0) {
            vec3 reflected = reflect(unit_direction, rec.normal);
            scattered = ray(rec.p, reflected);
            return true;
        }

        vec3 refracted = refract(unit_direction, rec.normal, etai_over_etat);
        scattered = ray(rec.p, refracted, r_in.time());

        return true;
    }